

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_floor(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  double dVar1;
  Value local_60 [2];
  String local_40;
  Value x;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  x.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"x");
  Context::GetVar((Context *)&stack0xffffffffffffffd0,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  dVar1 = Value::DoubleValue((Value *)&stack0xffffffffffffffd0);
  dVar1 = floor(dVar1);
  Value::Value(local_60,dVar1);
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,local_60,true);
  Value::~Value(local_60);
  Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_floor(Context *context, IntrinsicResult partialResult) {
		Value x = context->GetVar("x");
		return IntrinsicResult(floor(x.DoubleValue()));
	}